

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O1

void __thiscall OpenMD::NPT::moveA(NPT *this)

{
  Thermo *this_00;
  undefined8 *puVar1;
  double dVar2;
  Snapshot *pSVar3;
  RotationAlgorithm *pRVar4;
  RealType RVar5;
  long lVar6;
  undefined8 uVar7;
  uint i_1;
  uint uVar8;
  Molecule *pMVar9;
  Vector3d *pVVar10;
  double dVar11;
  uint i_6;
  long lVar12;
  double *pdVar13;
  pointer pVVar14;
  ulong uVar15;
  uint i_5;
  long lVar16;
  StuntDouble *pSVar17;
  pointer ppSVar18;
  int iVar19;
  pair<double,_double> pVar20;
  MoleculeIterator i;
  Vector<double,_3U> result;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_1;
  Vector3d vel;
  Vector3d pos;
  Vector3d ji;
  Vector3d sc;
  Vector3d frc;
  Vector3d Tb;
  Vector3d COM;
  MoleculeIterator local_1a0;
  Vector3d local_198;
  Vector3d local_178;
  double local_158 [4];
  double local_138 [4];
  double local_118 [4];
  double local_f8 [3];
  pair<double,_double> *local_e0;
  double local_d8 [4];
  double local_b8 [4];
  double local_98 [4];
  Mat3x3d local_78;
  
  local_1a0._M_node = (_Base_ptr)0x0;
  local_98[2] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_f8[2] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_138[2] = 0.0;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_118[2] = 0.0;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_d8[2] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  pVar20 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  (this->thermostat).first = pVar20.first;
  (this->thermostat).second = pVar20.second;
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x18])(this);
  this_00 = &(this->super_VelocityVerletIntegrator).super_Integrator.thermo;
  RVar5 = Thermo::getTemperature(this_00);
  this->instaTemp = RVar5;
  Thermo::getPressureTensor(&local_78,this_00);
  if (&this->press != &local_78) {
    lVar12 = 0;
    do {
      *(undefined8 *)
       ((long)(this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
       + lVar12 + 0x10) =
           *(undefined8 *)
            ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar12 + 0x10);
      uVar7 = *(undefined8 *)
               ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar12 + 8);
      puVar1 = (undefined8 *)
               ((long)(this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_[0] + lVar12);
      *puVar1 = *(undefined8 *)
                 ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar12);
      puVar1[1] = uVar7;
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x48);
  }
  local_e0 = &this->thermostat;
  this->instaPress =
       (((this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] +
         (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] +
        (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]) *
       163882576.0) / 3.0;
  RVar5 = Thermo::getVolume(this_00);
  this->instaVol = RVar5;
  Thermo::getCom((Vector3d *)&local_78,this_00);
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x13])(this);
  pMVar9 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_1a0);
  if (pMVar9 != (Molecule *)0x0) {
    do {
      ppSVar18 = (pMVar9->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (ppSVar18 ==
            (pMVar9->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar17 = (StuntDouble *)0x0;
        }
        else {
          pSVar17 = *ppSVar18;
        }
        if (pSVar17 == (StuntDouble *)0x0) break;
        pSVar3 = pSVar17->snapshotMan_->currentSnapshot_;
        lVar12 = *(long *)((long)&(pSVar3->atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_);
        lVar16 = (long)pSVar17->localIndex_ * 0x18;
        pdVar13 = (double *)(lVar12 + lVar16);
        local_138[0] = *pdVar13;
        local_138[1] = pdVar13[1];
        local_138[2] = *(double *)(lVar12 + 0x10 + lVar16);
        lVar12 = *(long *)((long)&(pSVar3->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_);
        local_b8[2] = *(double *)(lVar12 + 0x10 + lVar16);
        pdVar13 = (double *)(lVar12 + lVar16);
        local_b8[0] = *pdVar13;
        local_b8[1] = pdVar13[1];
        local_158[3] = pSVar17->mass_;
        (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x10])
                  (this,local_d8,local_138);
        dVar11 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
        local_198.super_Vector<double,_3U>.data_[0] = 0.0;
        local_198.super_Vector<double,_3U>.data_[1] = 0.0;
        local_198.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar12 = 0;
        do {
          local_198.super_Vector<double,_3U>.data_[lVar12] =
               local_b8[lVar12] * ((dVar11 * 0.0004184) / local_158[3]);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_158[0] = 0.0;
        local_158[1] = 0.0;
        local_158[2] = 0.0;
        lVar12 = 0;
        do {
          local_158[lVar12] = local_d8[lVar12] * dVar11;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_178.super_Vector<double,_3U>.data_[0] = 0.0;
        local_178.super_Vector<double,_3U>.data_[1] = 0.0;
        local_178.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar12 = 0;
        do {
          local_178.super_Vector<double,_3U>.data_[lVar12] =
               local_198.super_Vector<double,_3U>.data_[lVar12] - local_158[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        do {
          local_138[lVar12] = local_178.super_Vector<double,_3U>.data_[lVar12] + local_138[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        pSVar3 = pSVar17->snapshotMan_->currentSnapshot_;
        lVar12 = (long)pSVar17->localIndex_ * 0x18;
        pdVar13 = (double *)
                  (*(long *)((long)&(pSVar3->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_) +
                  lVar12);
        if (pdVar13 != local_138) {
          lVar16 = 0;
          do {
            pdVar13[lVar16] = local_138[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
        }
        if (pSVar17->objType_ - otDAtom < 2) {
          pVVar10 = (Vector3d *)
                    (lVar12 + *(long *)((long)&(pSVar3->atomData).torque.
                                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                       pSVar17->storage_));
          local_198.super_Vector<double,_3U>.data_[0] = 0.0;
          local_198.super_Vector<double,_3U>.data_[1] = 0.0;
          local_198.super_Vector<double,_3U>.data_[2] = 0.0;
          if (pVVar10 != &local_198) {
            lVar12 = 0;
            do {
              local_198.super_Vector<double,_3U>.data_[lVar12] =
                   (pVVar10->super_Vector<double,_3U>).data_[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
          }
          StuntDouble::lab2Body(&local_178,pSVar17,&local_198);
          local_98[2] = local_178.super_Vector<double,_3U>.data_[2];
          local_98[0] = local_178.super_Vector<double,_3U>.data_[0];
          local_98[1] = local_178.super_Vector<double,_3U>.data_[1];
          lVar12 = *(long *)((long)&(pSVar17->snapshotMan_->currentSnapshot_->atomData).
                                    angularMomentum.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_);
          pdVar13 = (double *)(lVar12 + (long)pSVar17->localIndex_ * 0x18);
          local_f8[2] = (double)*(undefined8 *)(lVar12 + 0x10 + (long)pSVar17->localIndex_ * 0x18);
          local_f8[0] = *pdVar13;
          local_f8[1] = pdVar13[1];
          dVar11 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
          local_198.super_Vector<double,_3U>.data_[0] = 0.0;
          local_198.super_Vector<double,_3U>.data_[1] = 0.0;
          local_198.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar12 = 0;
          do {
            local_198.super_Vector<double,_3U>.data_[lVar12] = local_98[lVar12] * dVar11 * 0.0004184
            ;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          dVar2 = local_e0->first;
          local_158[0] = 0.0;
          local_158[1] = 0.0;
          local_158[2] = 0.0;
          lVar12 = 0;
          do {
            local_158[lVar12] = local_f8[lVar12] * dVar11 * dVar2;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          local_178.super_Vector<double,_3U>.data_[0] = 0.0;
          local_178.super_Vector<double,_3U>.data_[1] = 0.0;
          local_178.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar12 = 0;
          do {
            local_178.super_Vector<double,_3U>.data_[lVar12] =
                 local_198.super_Vector<double,_3U>.data_[lVar12] - local_158[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          lVar12 = 0;
          do {
            local_f8[lVar12] = local_178.super_Vector<double,_3U>.data_[lVar12] + local_f8[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          pRVar4 = (this->super_VelocityVerletIntegrator).super_Integrator.rotAlgo_;
          (*pRVar4->_vptr_RotationAlgorithm[2])
                    (SUB84((this->super_VelocityVerletIntegrator).super_Integrator.dt,0),pRVar4,
                     pSVar17,local_f8);
          pdVar13 = (double *)
                    ((long)pSVar17->localIndex_ * 0x18 +
                    *(long *)((long)&(pSVar17->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_))
          ;
          if (pdVar13 != local_f8) {
            lVar12 = 0;
            do {
              pdVar13[lVar12] = local_f8[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
          }
        }
        ppSVar18 = ppSVar18 + 1;
      }
      pMVar9 = SimInfo::nextMolecule
                         ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_1a0);
    } while (pMVar9 != (Molecule *)0x0);
  }
  (this->thermostat).first =
       ((this->instaTemp / this->targetTemp + -1.0) *
       (this->super_VelocityVerletIntegrator).super_Integrator.dt2) / this->tt2 +
       (this->thermostat).first;
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x15])(this);
  (this->thermostat).second =
       (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * (this->thermostat).first +
       (this->thermostat).second;
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[4])();
  pMVar9 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_1a0);
  if (pMVar9 != (Molecule *)0x0) {
    iVar19 = 0;
    do {
      ppSVar18 = (pMVar9->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar18 ==
          (pMVar9->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar17 = (StuntDouble *)0x0;
      }
      else {
        pSVar17 = *ppSVar18;
      }
      if (pSVar17 != (StuntDouble *)0x0) {
        pVVar14 = (this->oldPos).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar19;
        do {
          ppSVar18 = ppSVar18 + 1;
          lVar12 = *(long *)((long)&(pSVar17->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_);
          pdVar13 = (double *)(lVar12 + (long)pSVar17->localIndex_ * 0x18);
          dVar11 = *pdVar13;
          dVar2 = pdVar13[1];
          (pVVar14->super_Vector<double,_3U>).data_[2] =
               *(double *)(lVar12 + 0x10 + (long)pSVar17->localIndex_ * 0x18);
          (pVVar14->super_Vector<double,_3U>).data_[0] = dVar11;
          (pVVar14->super_Vector<double,_3U>).data_[1] = dVar2;
          if (ppSVar18 ==
              (pMVar9->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar17 = (StuntDouble *)0x0;
          }
          else {
            pSVar17 = *ppSVar18;
          }
          pVVar14 = pVVar14 + 1;
          iVar19 = iVar19 + 1;
        } while (pSVar17 != (StuntDouble *)0x0);
      }
      pMVar9 = SimInfo::nextMolecule
                         ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_1a0);
    } while (pMVar9 != (Molecule *)0x0);
  }
  if (0 < this->maxIterNum_) {
    dVar11 = 0.0;
    do {
      local_158[3] = dVar11;
      pMVar9 = SimInfo::beginMolecule
                         ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_1a0);
      if (pMVar9 != (Molecule *)0x0) {
        uVar15 = 0;
        do {
          ppSVar18 = (pMVar9->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppSVar18 ==
              (pMVar9->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar17 = (StuntDouble *)0x0;
          }
          else {
            pSVar17 = *ppSVar18;
          }
          if (pSVar17 != (StuntDouble *)0x0) {
            uVar15 = (ulong)(int)uVar15;
            lVar12 = uVar15 * 0x18;
            do {
              pSVar3 = pSVar17->snapshotMan_->currentSnapshot_;
              lVar16 = *(long *)((long)&(pSVar3->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar17->storage_);
              lVar6 = (long)pSVar17->localIndex_ * 0x18;
              pdVar13 = (double *)(lVar16 + lVar6);
              local_138[0] = *pdVar13;
              local_138[1] = pdVar13[1];
              local_138[2] = *(double *)(lVar16 + 0x10 + lVar6);
              lVar16 = *(long *)((long)&(pSVar3->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar17->storage_);
              pdVar13 = (double *)(lVar16 + lVar6);
              local_118[0] = *pdVar13;
              local_118[1] = pdVar13[1];
              local_118[2] = *(double *)(lVar16 + 0x10 + lVar6);
              (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x12])
                        (this,local_118,&local_78,uVar15 & 0xffffffff,local_d8);
              pVVar14 = (this->oldPos).
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              dVar11 = (this->super_VelocityVerletIntegrator).super_Integrator.dt;
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              local_158[2] = 0.0;
              lVar16 = 0;
              do {
                local_158[lVar16] = local_138[lVar16] + local_d8[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              local_198.super_Vector<double,_3U>.data_[0] = 0.0;
              local_198.super_Vector<double,_3U>.data_[1] = 0.0;
              local_198.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar16 = 0;
              do {
                local_198.super_Vector<double,_3U>.data_[lVar16] = local_158[lVar16] * dVar11;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              local_178.super_Vector<double,_3U>.data_[0] = 0.0;
              local_178.super_Vector<double,_3U>.data_[1] = 0.0;
              local_178.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar16 = 0;
              do {
                local_178.super_Vector<double,_3U>.data_[lVar16] =
                     *(double *)
                      ((long)(pVVar14->super_Vector<double,_3U>).data_ + lVar16 * 8 + lVar12) +
                     local_198.super_Vector<double,_3U>.data_[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              local_118[2] = local_178.super_Vector<double,_3U>.data_[2];
              local_118[0] = local_178.super_Vector<double,_3U>.data_[0];
              local_118[1] = local_178.super_Vector<double,_3U>.data_[1];
              pdVar13 = (double *)
                        ((long)pSVar17->localIndex_ * 0x18 +
                        *(long *)((long)&(pSVar17->snapshotMan_->currentSnapshot_->atomData).
                                         position.
                                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                 pSVar17->storage_));
              if (pdVar13 != local_118) {
                lVar16 = 0;
                do {
                  pdVar13[lVar16] = local_118[lVar16];
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 3);
              }
              ppSVar18 = ppSVar18 + 1;
              if (ppSVar18 ==
                  (pMVar9->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pSVar17 = (StuntDouble *)0x0;
              }
              else {
                pSVar17 = *ppSVar18;
              }
              uVar15 = uVar15 + 1;
              lVar12 = lVar12 + 0x18;
            } while (pSVar17 != (StuntDouble *)0x0);
          }
          pMVar9 = SimInfo::nextMolecule
                             ((this->super_VelocityVerletIntegrator).super_Integrator.info_,
                              &local_1a0);
        } while (pMVar9 != (Molecule *)0x0);
      }
      Rattle::constraintA((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
      uVar8 = SUB84(local_158[3],0) + 1;
      dVar11 = (double)(ulong)uVar8;
    } while ((int)uVar8 < this->maxIterNum_);
  }
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x17])(this);
  Snapshot::setThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap,local_e0);
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void NPT::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb, ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d sc;
    int index;

    thermostat = snap->getThermostat();
    loadEta();

    instaTemp  = thermo.getTemperature();
    press      = thermo.getPressureTensor();
    instaPress = Constants::pressureConvert *
                 (press(0, 0) + press(1, 1) + press(2, 2)) / 3.0;
    instaVol = thermo.getVolume();

    Vector3d COM = thermo.getCom();

    // evolve velocity half step

    calcVelScale();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        frc = sd->getFrc();

        mass = sd->getMass();

        getVelScaleA(sc, vel);

        // velocity half step  (use chi from previous step here):

        vel += dt2 * Constants::energyConvert / mass * frc - dt2 * sc;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji +=
              dt2 * Constants::energyConvert * Tb - dt2 * thermostat.first * ji;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }
    // evolve chi and eta  half step

    thermostat.first += dt2 * (instaTemp / targetTemp - 1.0) / tt2;

    evolveEtaA();

    // calculate the integral of chidt
    thermostat.second += dt2 * thermostat.first;

    flucQ_->moveA();

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldPos[index++] = sd->getPos();
      }
    }

    // the first estimation of r(t+dt) is equal to  r(t)

    for (int k = 0; k < maxIterNum_; k++) {
      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          vel = sd->getVel();
          pos = sd->getPos();

          this->getPosScale(pos, COM, index, sc);

          pos = oldPos[index] + dt * (vel + sc);
          sd->setPos(pos);

          ++index;
        }
      }

      rattle_->constraintA();
    }

    // Scale the box after all the positions have been moved:

    this->scaleSimBox();

    snap->setThermostat(thermostat);

    saveEta();
  }